

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

void Abc_NtkFxInsert(Abc_Ntk_t *pNtk,Vec_Wec_t *vCubes)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Abc_Obj_t *pFanin;
  int *piVar3;
  void **ppvVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  Abc_Obj_t *pAVar9;
  void *__s;
  void *__s_00;
  void *__s_01;
  Vec_Ptr_t *pVVar10;
  char *pSop;
  int **ppiVar11;
  char *pcVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0xba,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
  }
  lVar8 = (long)vCubes->nSize;
  if (0 < lVar8) {
    lVar18 = 0;
    iVar17 = -1;
    do {
      if (*(int *)((long)&vCubes->pArray->nSize + lVar18) < 1) {
        __assert_fail("Vec_IntSize(vCube) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                      ,0xbf,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
      }
      iVar15 = **(int **)((long)&vCubes->pArray->pArray + lVar18);
      if (iVar15 < iVar17) {
        __assert_fail("Lit <= Vec_IntEntry(vCube, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                      ,0xc0,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
      }
      lVar18 = lVar18 + 0x10;
      iVar17 = iVar15;
    } while (lVar8 << 4 != lVar18);
  }
  if (vCubes->nSize < 1) {
    iVar17 = 0;
  }
  else {
    lVar18 = 0;
    iVar17 = 0;
    do {
      if (*(int *)((long)&vCubes->pArray->nSize + lVar18) < 1) goto LAB_00258d2a;
      iVar15 = **(int **)((long)&vCubes->pArray->pArray + lVar18);
      if (iVar17 <= iVar15) {
        iVar17 = iVar15;
      }
      lVar18 = lVar18 + 0x10;
    } while (lVar8 * 0x10 != lVar18);
  }
  iVar15 = pNtk->vObjs->nSize;
  if (iVar17 < iVar15) {
    puts("The network is unchanged by fast extract.");
    return;
  }
  do {
    pAVar9 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
    if (iVar15 != pAVar9->Id) {
      __assert_fail("i == (int)Abc_ObjId(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                    ,0xd0,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
    }
    iVar15 = iVar15 + 1;
  } while (iVar17 + 1 != iVar15);
  pVVar10 = pNtk->vObjs;
  iVar17 = pVVar10->nSize;
  lVar8 = (long)iVar17;
  iVar15 = iVar17;
  if (iVar17 - 1U < 0xf) {
    iVar15 = 0x10;
  }
  if (iVar15 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar15 << 2);
  }
  __s_00 = (void *)0x0;
  memset(__s,0,lVar8 * 4);
  iVar15 = pVVar10->nSize;
  iVar7 = 0x10;
  if (0xe < iVar15 - 1U) {
    iVar7 = iVar15;
  }
  if (iVar7 != 0) {
    __s_00 = malloc((long)iVar7 << 2);
  }
  memset(__s_00,0,(long)iVar15 * 4);
  iVar7 = vCubes->nSize;
  if (0 < (long)iVar7) {
    ppiVar11 = &vCubes->pArray->pArray;
    lVar18 = 0;
    do {
      if (*(int *)((long)ppiVar11 + -4) < 1) goto LAB_00258d2a;
      iVar14 = **ppiVar11;
      lVar16 = (long)iVar14;
      if ((lVar16 < 0) || (iVar15 <= iVar14)) goto LAB_00258d2a;
      iVar1 = *(int *)((long)__s_00 + lVar16 * 4);
      if (iVar1 == 0) {
        if (iVar17 <= iVar14) {
LAB_00258dc5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(int *)((long)__s + lVar16 * 4) = (int)lVar18;
      }
      *(int *)((long)__s_00 + lVar16 * 4) = iVar1 + 1;
      lVar18 = lVar18 + 1;
      ppiVar11 = ppiVar11 + 2;
    } while (iVar7 != lVar18);
  }
  iVar17 = pVVar10->nSize;
  iVar7 = 0x10;
  if (0xe < iVar17 - 1U) {
    iVar7 = iVar17;
  }
  if (iVar7 == 0) {
    __s_01 = (void *)0x0;
  }
  else {
    __s_01 = malloc((long)iVar7 << 2);
  }
  memset(__s_01,0xff,(long)iVar17 * 4);
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    uVar13 = 0;
    do {
      pAVar9 = (Abc_Obj_t *)pVVar10->pArray[uVar13];
      if ((pAVar9 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar9->field_0x14 & 0xf) == 7)) {
        Abc_ObjRemoveFanins(pAVar9);
        if ((long)iVar15 <= (long)uVar13) goto LAB_00258d2a;
        if (*(int *)((long)__s_00 + uVar13 * 4) < 1) {
          __assert_fail("Vec_IntEntry(vCount, i) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                        ,0xe3,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
        }
        iVar7 = *(int *)((long)__s_00 + uVar13 * 4);
        if (0 < iVar7) {
          if (lVar8 <= (long)uVar13) {
LAB_00258d2a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar14 = 0;
          do {
            uVar5 = *(int *)((long)__s + uVar13 * 4) + iVar14;
            if (((int)uVar5 < 0) || (vCubes->nSize <= (int)uVar5)) goto LAB_00258da6;
            pVVar2 = vCubes->pArray;
            if (pVVar2[uVar5].nSize < 1) goto LAB_00258d2a;
            if (uVar13 != (uint)*pVVar2[uVar5].pArray) {
              __assert_fail("Vec_IntEntry( vCube, 0 ) == i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                            ,0xe7,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
            }
            if (1 < pVVar2[uVar5].nSize) {
              lVar18 = 1;
              do {
                if (pVVar2[uVar5].pArray[lVar18] < 0) goto LAB_00258d49;
                uVar6 = (uint)pVVar2[uVar5].pArray[lVar18] >> 1;
                if (pNtk->vObjs->nSize <= (int)uVar6) goto LAB_00258d68;
                pFanin = (Abc_Obj_t *)pNtk->vObjs->pArray[uVar6];
                iVar7 = pFanin->Id;
                lVar16 = (long)iVar7;
                if ((lVar16 < 0) || (iVar17 <= iVar7)) goto LAB_00258d2a;
                if (*(int *)((long)__s_01 + lVar16 * 4) < 0) {
                  *(int *)((long)__s_01 + lVar16 * 4) = (pAVar9->vFanins).nSize;
                  Abc_ObjAddFanin(pAVar9,pFanin);
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 < pVVar2[uVar5].nSize);
            }
            iVar14 = iVar14 + 1;
            iVar7 = *(int *)((long)__s_00 + uVar13 * 4);
          } while (iVar14 < iVar7);
        }
        pSop = Abc_SopStart((Mem_Flex_t *)pNtk->pManFunc,iVar7,(pAVar9->vFanins).nSize);
        if (0 < *(int *)((long)__s_00 + uVar13 * 4)) {
          if (lVar8 <= (long)uVar13) goto LAB_00258d2a;
          iVar7 = 0;
          pcVar12 = pSop;
          do {
            uVar5 = *(int *)((long)__s + uVar13 * 4) + iVar7;
            if (((int)uVar5 < 0) || (vCubes->nSize <= (int)uVar5)) {
LAB_00258da6:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            pVVar2 = vCubes->pArray;
            if (pVVar2[uVar5].nSize < 1) goto LAB_00258d2a;
            if (uVar13 != (uint)*pVVar2[uVar5].pArray) {
              __assert_fail("Vec_IntEntry( vCube, 0 ) == i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                            ,0xf6,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
            }
            if (1 < pVVar2[uVar5].nSize) {
              lVar18 = 1;
              do {
                uVar6 = pVVar2[uVar5].pArray[lVar18];
                if ((int)uVar6 < 0) {
LAB_00258d49:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                ,0x10c,"int Abc_Lit2Var(int)");
                }
                if (pNtk->vObjs->nSize <= (int)(uVar6 >> 1)) {
LAB_00258d68:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                iVar14 = *(int *)((long)pNtk->vObjs->pArray[uVar6 >> 1] + 0x10);
                if (((long)iVar14 < 0) || (iVar17 <= iVar14)) goto LAB_00258d2a;
                iVar14 = *(int *)((long)__s_01 + (long)iVar14 * 4);
                if (((long)iVar14 < 0) || ((pAVar9->vFanins).nSize <= iVar14)) {
                  __assert_fail("iFanin >= 0 && iFanin < Abc_ObjFaninNum(pNode)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                                ,0xfb,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
                }
                pcVar12[iVar14] = (byte)uVar6 & 1 ^ 0x31;
                lVar18 = lVar18 + 1;
              } while (lVar18 < pVVar2[uVar5].nSize);
            }
            pcVar12 = pcVar12 + (long)(pAVar9->vFanins).nSize + 3;
            iVar7 = iVar7 + 1;
          } while (iVar7 < *(int *)((long)__s_00 + uVar13 * 4));
        }
        if (((char *)(pAVar9->field_5).pData != (char *)0x0) &&
           (iVar7 = Abc_SopIsComplement((char *)(pAVar9->field_5).pData), iVar7 != 0)) {
          Abc_SopComplement(pSop);
        }
        (pAVar9->field_5).pData = pSop;
        if (0 < (pAVar9->vFanins).nSize) {
          piVar3 = (pAVar9->vFanins).pArray;
          ppvVar4 = pAVar9->pNtk->vObjs->pArray;
          lVar18 = 0;
          do {
            iVar7 = *(int *)((long)ppvVar4[piVar3[lVar18]] + 0x10);
            if (((long)iVar7 < 0) || (iVar17 <= iVar7)) goto LAB_00258dc5;
            *(undefined4 *)((long)__s_01 + (long)iVar7 * 4) = 0xffffffff;
            lVar18 = lVar18 + 1;
          } while (lVar18 < (pAVar9->vFanins).nSize);
        }
      }
      uVar13 = uVar13 + 1;
      pVVar10 = pNtk->vObjs;
    } while ((long)uVar13 < (long)pVVar10->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (__s_01 == (void *)0x0) {
    return;
  }
  free(__s_01);
  return;
}

Assistant:

void Abc_NtkFxInsert( Abc_Ntk_t * pNtk, Vec_Wec_t * vCubes )
{
    Vec_Int_t * vCube, * vPres, * vFirst, * vCount;
    Abc_Obj_t * pNode, * pFanin;
    char * pCube, * pSop;
    int i, k, v, Lit, iFanin, iNodeMax = 0;
    assert( Abc_NtkIsSopLogic(pNtk) );
    // check that cubes have no gaps and are ordered by first node
    Lit = -1;
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        assert( Vec_IntSize(vCube) > 0 );
        assert( Lit <= Vec_IntEntry(vCube, 0) );
        Lit = Vec_IntEntry(vCube, 0);
    }
    // find the largest index
    Vec_WecForEachLevel( vCubes, vCube, i )
        iNodeMax = Abc_MaxInt( iNodeMax, Vec_IntEntry(vCube, 0) );
    // quit if nothing changes
    if ( iNodeMax < Abc_NtkObjNumMax(pNtk) )
    {
        printf( "The network is unchanged by fast extract.\n" );
        return;
    }
    // create new nodes
    for ( i = Abc_NtkObjNumMax(pNtk); i <= iNodeMax; i++ )
    {
        pNode = Abc_NtkCreateNode( pNtk );
        assert( i == (int)Abc_ObjId(pNode) );
    }
    // create node fanins
    vFirst = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    vCount = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        iFanin = Vec_IntEntry( vCube, 0 );
        if ( Vec_IntEntry(vCount, iFanin) == 0 )
            Vec_IntWriteEntry( vFirst, iFanin, i );
        Vec_IntAddToEntry( vCount, iFanin, 1 );
    }
    // create node SOPs
    vPres = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
//        if ( Vec_IntEntry(vCount, i) == 0 ) continue;
        Abc_ObjRemoveFanins( pNode );
        // create fanins
        assert( Vec_IntEntry(vCount, i) > 0 );
        for ( k = 0; k < Vec_IntEntry(vCount, i); k++ )
        {
            vCube = Vec_WecEntry( vCubes, Vec_IntEntry(vFirst, i) + k );
            assert( Vec_IntEntry( vCube, 0 ) == i );
            Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
            {
                pFanin = Abc_NtkObj(pNtk, Abc_Lit2Var(Lit));
                if ( Vec_IntEntry(vPres, Abc_ObjId(pFanin)) >= 0 )
                    continue;
                Vec_IntWriteEntry(vPres, Abc_ObjId(pFanin), Abc_ObjFaninNum(pNode));
                Abc_ObjAddFanin( pNode, pFanin );
            }
        }
        // create SOP
        pSop = pCube = Abc_SopStart( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntEntry(vCount, i), Abc_ObjFaninNum(pNode) );
        for ( k = 0; k < Vec_IntEntry(vCount, i); k++ )
        {
            vCube = Vec_WecEntry( vCubes, Vec_IntEntry(vFirst, i) + k );
            assert( Vec_IntEntry( vCube, 0 ) == i );
            Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
            {
                pFanin = Abc_NtkObj(pNtk, Abc_Lit2Var(Lit));
                iFanin = Vec_IntEntry(vPres, Abc_ObjId(pFanin));
                assert( iFanin >= 0 && iFanin < Abc_ObjFaninNum(pNode) );
                pCube[iFanin] = Abc_LitIsCompl(Lit) ? '0' : '1';
            }
            pCube += Abc_ObjFaninNum(pNode) + 3;
        }
        // complement SOP if the original one was complemented
        if ( pNode->pData && Abc_SopIsComplement((char *)pNode->pData) )
            Abc_SopComplement( pSop );
        pNode->pData = pSop;
        // clean fanins
        Abc_ObjForEachFanin( pNode, pFanin, v )
            Vec_IntWriteEntry( vPres, Abc_ObjId(pFanin), -1 );
    }
    Vec_IntFree( vFirst );
    Vec_IntFree( vCount );
    Vec_IntFree( vPres );
}